

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextcursor.cpp
# Opt level: O0

void __thiscall
QTextCursor::insertImage(QTextCursor *this,QTextImageFormat *format,Position alignment)

{
  bool bVar1;
  uint uVar2;
  QTextCursorPrivate *pQVar3;
  QTextFormat *format_00;
  undefined4 in_EDX;
  QTextDocumentPrivate *in_RSI;
  char *__filename;
  QTextDocumentPrivate *in_RDI;
  long in_FS_OFFSET;
  int idx;
  QTextObject *obj;
  QTextImageFormat fmt;
  QTextFrameFormat ffmt;
  QTextImageFormat *in_stack_ffffffffffffff88;
  QTextObject *in_stack_ffffffffffffff90;
  QTextDocumentPrivate *this_00;
  int in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  int iVar4;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  undefined8 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb8;
  undefined2 uVar5;
  QChar c;
  QChar local_2a;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  iVar4 = (int)((ulong)in_stack_ffffffffffffffb0 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  uVar5 = (undefined2)in_EDX;
  c.ucs = (char16_t)((uint)in_EDX >> 0x10);
  bVar1 = QSharedDataPointer<QTextCursorPrivate>::operator!
                    ((QSharedDataPointer<QTextCursorPrivate> *)0x7a6553);
  if ((!bVar1) &&
     (pQVar3 = QSharedDataPointer<QTextCursorPrivate>::operator->
                         ((QSharedDataPointer<QTextCursorPrivate> *)in_stack_ffffffffffffff90),
     pQVar3->priv != (QTextDocumentPrivate *)0x0)) {
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    local_10 = &DAT_aaaaaaaaaaaaaaaa;
    QTextFrameFormat::QTextFrameFormat((QTextFrameFormat *)in_stack_ffffffffffffff90);
    QTextFrameFormat::setPosition
              ((QTextFrameFormat *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
               (Position)((ulong)in_stack_ffffffffffffff90 >> 0x20));
    QSharedDataPointer<QTextCursorPrivate>::operator->
              ((QSharedDataPointer<QTextCursorPrivate> *)in_stack_ffffffffffffff90);
    format_00 = (QTextFormat *)
                QTextDocumentPrivate::createObject
                          (in_RSI,(QTextFormat *)
                                  CONCAT26(c.ucs,CONCAT24(uVar5,in_stack_ffffffffffffffb8)),iVar4);
    local_28 = &DAT_aaaaaaaaaaaaaaaa;
    local_20 = &DAT_aaaaaaaaaaaaaaaa;
    QTextImageFormat::QTextImageFormat
              ((QTextImageFormat *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    uVar2 = QTextObject::objectIndex(in_stack_ffffffffffffff90);
    __filename = (char *)(ulong)uVar2;
    QTextFormat::setObjectIndex
              ((QTextFormat *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
               (int)((ulong)in_RDI >> 0x20));
    pQVar3 = QSharedDataPointer<QTextCursorPrivate>::operator->
                       ((QSharedDataPointer<QTextCursorPrivate> *)in_stack_ffffffffffffff90);
    QTextDocumentPrivate::beginEditBlock(pQVar3->priv);
    pQVar3 = QSharedDataPointer<QTextCursorPrivate>::operator->
                       ((QSharedDataPointer<QTextCursorPrivate> *)in_stack_ffffffffffffff90);
    QTextCursorPrivate::remove(pQVar3,__filename);
    pQVar3 = QSharedDataPointer<QTextCursorPrivate>::operator->
                       ((QSharedDataPointer<QTextCursorPrivate> *)in_stack_ffffffffffffff90);
    QTextDocumentPrivate::formatCollection(pQVar3->priv);
    QTextFormatCollection::indexForFormat
              ((QTextFormatCollection *)CONCAT26(c.ucs,CONCAT24(uVar5,in_stack_ffffffffffffffb8)),
               format_00);
    pQVar3 = QSharedDataPointer<QTextCursorPrivate>::operator->
                       ((QSharedDataPointer<QTextCursorPrivate> *)in_stack_ffffffffffffff90);
    this_00 = pQVar3->priv;
    pQVar3 = QSharedDataPointer<QTextCursorPrivate>::operator->
                       ((QSharedDataPointer<QTextCursorPrivate> *)this_00);
    iVar4 = pQVar3->position;
    QChar::QChar<QChar::SpecialCharacter,_true>(&local_2a,ObjectReplacementCharacter);
    QTextDocumentPrivate::insert(in_RDI,iVar4,c,in_stack_ffffffffffffff98);
    QSharedDataPointer<QTextCursorPrivate>::operator->
              ((QSharedDataPointer<QTextCursorPrivate> *)this_00);
    QTextDocumentPrivate::endEditBlock(this_00);
    QTextImageFormat::~QTextImageFormat((QTextImageFormat *)0x7a66ac);
    QTextFrameFormat::~QTextFrameFormat((QTextFrameFormat *)0x7a66b6);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTextCursor::insertImage(const QTextImageFormat &format, QTextFrameFormat::Position alignment)
{
    if (!d || !d->priv)
        return;

    QTextFrameFormat ffmt;
    ffmt.setPosition(alignment);
    QTextObject *obj = d->priv->createObject(ffmt);

    QTextImageFormat fmt = format;
    fmt.setObjectIndex(obj->objectIndex());

    d->priv->beginEditBlock();
    d->remove();
    const int idx = d->priv->formatCollection()->indexForFormat(fmt);
    d->priv->insert(d->position, QChar(QChar::ObjectReplacementCharacter), idx);
    d->priv->endEditBlock();
}